

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_next_symbol(archive_read *a,huffman_code *code)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong *puVar6;
  long *in_RSI;
  archive *in_RDI;
  rar_br *br;
  rar *rar;
  int node;
  int value;
  int length;
  uint bits;
  uchar bit;
  huffman_code *in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar7;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if ((in_RSI[3] == 0) &&
     (iVar3 = make_table(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), iVar3 != 0)) {
    local_4 = -1;
  }
  else {
    lVar1 = *(long *)in_RDI[0x15].archive_format_name;
    puVar6 = (ulong *)(lVar1 + 0x4ec8);
    if ((*(int *)(lVar1 + 0x4ed0) < *(int *)((long)in_RSI + 0x14)) &&
       ((iVar3 = rar_br_fillup((archive_read *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                               (rar_br *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
        iVar3 == 0 && ((int)puVar6[1] < *(int *)((long)in_RSI + 0x14))))) {
      archive_set_error(in_RDI,0x54,"Truncated RAR file data");
      *(undefined1 *)(lVar1 + 200) = 0;
      local_4 = -1;
    }
    else {
      uVar4 = (uint)(*puVar6 >>
                    ((char)(int)puVar6[1] - (char)*(undefined4 *)((long)in_RSI + 0x14) & 0x3fU)) &
              cache_masks[*(int *)((long)in_RSI + 0x14)];
      iVar3 = *(int *)(in_RSI[3] + (ulong)uVar4 * 8);
      local_4 = *(int *)(in_RSI[3] + 4 + (ulong)uVar4 * 8);
      if (iVar3 < 0) {
        archive_set_error(in_RDI,0x54,"Invalid prefix code in bitstream");
        local_4 = -1;
      }
      else if (*(int *)((long)in_RSI + 0x14) < iVar3) {
        *(int *)(puVar6 + 1) = (int)puVar6[1] - *(int *)((long)in_RSI + 0x14);
        iVar7 = local_4;
        while (*(int *)(*in_RSI + (long)local_4 * 8) != *(int *)(*in_RSI + 4 + (long)local_4 * 8)) {
          if ((((int)puVar6[1] < 1) &&
              (iVar5 = rar_br_fillup((archive_read *)CONCAT44(iVar3,iVar7),
                                     (rar_br *)CONCAT44(local_4,in_stack_ffffffffffffffd0)),
              iVar5 == 0)) && ((int)puVar6[1] < 1)) {
            archive_set_error(in_RDI,0x54,"Truncated RAR file data");
            *(undefined1 *)(lVar1 + 200) = 0;
            return -1;
          }
          bVar2 = (byte)(*puVar6 >> ((char)(int)puVar6[1] - 1U & 0x3f)) & 1;
          *(int *)(puVar6 + 1) = (int)puVar6[1] + -1;
          if (*(int *)(*in_RSI + (long)local_4 * 8 + (ulong)bVar2 * 4) < 0) {
            archive_set_error(in_RDI,0x54,"Invalid prefix code in bitstream");
            return -1;
          }
          local_4 = *(int *)(*in_RSI + (long)local_4 * 8 + (ulong)bVar2 * 4);
        }
        local_4 = *(int *)(*in_RSI + (long)local_4 * 8);
      }
      else {
        *(int *)(puVar6 + 1) = (int)puVar6[1] - iVar3;
      }
    }
  }
  return local_4;
}

Assistant:

static int
read_next_symbol(struct archive_read *a, struct huffman_code *code)
{
  unsigned char bit;
  unsigned int bits;
  int length, value, node;
  struct rar *rar;
  struct rar_br *br;

  if (!code->table)
  {
    if (make_table(a, code) != (ARCHIVE_OK))
      return -1;
  }

  rar = (struct rar *)(a->format->data);
  br = &(rar->br);

  /* Look ahead (peek) at bits */
  if (!rar_br_read_ahead(a, br, code->tablesize)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return -1;
  }
  bits = rar_br_bits(br, code->tablesize);

  length = code->table[bits].length;
  value = code->table[bits].value;

  if (length < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid prefix code in bitstream");
    return -1;
  }

  if (length <= code->tablesize)
  {
    /* Skip length bits */
    rar_br_consume(br, length);
    return value;
  }

  /* Skip tablesize bits */
  rar_br_consume(br, code->tablesize);

  node = value;
  while (!(code->tree[node].branches[0] ==
    code->tree[node].branches[1]))
  {
    if (!rar_br_read_ahead(a, br, 1)) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Truncated RAR file data");
      rar->valid = 0;
      return -1;
    }
    bit = rar_br_bits(br, 1);
    rar_br_consume(br, 1);

    if (code->tree[node].branches[bit] < 0)
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Invalid prefix code in bitstream");
      return -1;
    }
    node = code->tree[node].branches[bit];
  }

  return code->tree[node].branches[0];
}